

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFieldNonRepeatedWithRepeatedEncoding_Test
::~FeaturesTest_InvalidFieldNonRepeatedWithRepeatedEncoding_Test
          (FeaturesTest_InvalidFieldNonRepeatedWithRepeatedEncoding_Test *this)

{
  FeaturesTest_InvalidFieldNonRepeatedWithRepeatedEncoding_Test *this_local;
  
  ~FeaturesTest_InvalidFieldNonRepeatedWithRepeatedEncoding_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldNonRepeatedWithRepeatedEncoding) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        message_type {
          name: "Foo"
          field {
            name: "bar"
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_INT64
            options { features { repeated_field_encoding: EXPANDED } }
          }
        }
      )pb",
      "foo.proto: Foo.bar: NAME: Only repeated fields can specify repeated "
      "field encoding.\n");
}